

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::WebSocket> * __thiscall
kj::Own<kj::WebSocket>::operator=(Own<kj::WebSocket> *this,Own<kj::WebSocket> *other)

{
  Disposer *this_00;
  WebSocket *object;
  WebSocket *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::WebSocket> *other_local;
  Own<kj::WebSocket> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (WebSocket *)0x0;
  if (object != (WebSocket *)0x0) {
    Disposer::dispose<kj::WebSocket>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }